

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O2

void __thiscall BoardView::ShowInfoPane(BoardView *this)

{
  ImVec2 *size;
  ImVec2 IVar1;
  __shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *peVar3;
  pointer psVar4;
  __shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2> *p_Var5;
  __shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2> *p_Var6;
  ImVec2 IVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  bool bVar12;
  ImU32 col;
  ImGuiIO *pIVar13;
  ImDrawList *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  pointer psVar14;
  __shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2> *p_Var15;
  __shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2> *p_Var16;
  __shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2> *p_Var17;
  int iVar18;
  int iVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  shared_ptr<Component> part;
  SharedVector<Component> *__range7;
  shared_ptr<Pin> pin;
  string str;
  long local_4b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4b0;
  long local_4a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4a0;
  shared_ptr<Component> p;
  undefined1 local_478 [32];
  string local_458;
  char bn [128];
  
  pIVar13 = ImGui::GetIO();
  if ((this->config).showInfoPanel != true) {
    return;
  }
  fVar23 = (pIVar13->DisplaySize).x;
  size = &this->m_info_surface;
  fVar21 = (this->m_info_surface).x;
  fVar20 = DPIF(100.0);
  if (fVar20 <= fVar21) {
    bn._0_4_ = fVar23 - size->x;
  }
  else {
    fVar21 = DPIF(100.0);
    (this->m_info_surface).x = fVar21 + 1.0;
    bn._0_4_ = fVar23 - (fVar21 + 1.0);
    (this->m_board_surface).x = (float)bn._0_4_;
  }
  (this->m_info_surface).y = (this->m_board_surface).y;
  bn._4_4_ = this->m_menu_height;
  str._M_dataplus._M_p = (pointer)0x0;
  ImGui::SetNextWindowPos((ImVec2 *)bn,0,(ImVec2 *)&str);
  ImGui::SetNextWindowSize(size,0);
  ImGui::PushStyleVar(4,1.0);
  ImGui::Begin("Info Panel",(bool *)0x0,0x127);
  if (this->m_dragging_token == 0) {
    fVar21 = (pIVar13->MousePos).x;
    fVar20 = (this->m_board_surface).x;
    if ((fVar20 < fVar21) && (fVar22 = DPIF(12.0), fVar21 < fVar20 + fVar22)) {
      this_00 = ImGui::GetWindowDrawList();
      fVar21 = (this->m_board_surface).x;
      str._M_dataplus._M_p._4_4_ = this->m_menu_height;
      str._M_dataplus._M_p._0_4_ = fVar21;
      fVar20 = DPIF(12.0);
      pin.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)CONCAT44(this->m_menu_height + (this->m_board_surface).y,fVar20 + fVar21)
      ;
      bn[0] = -0x77;
      bn[1] = -0x78;
      bn[2] = '\b';
      bn[3] = '?';
      bn[4] = -0x77;
      bn[5] = -0x78;
      bn[6] = '\b';
      bn[7] = '?';
      bn[8] = -0x77;
      bn[9] = -0x78;
      bn[10] = '\b';
      bn[0xb] = '?';
      bn[0xc] = -0x77;
      bn[0xd] = -0x78;
      bn[0xe] = '\b';
      bn[0xf] = '?';
      col = ImGui::ColorConvertFloat4ToU32((ImVec4 *)bn);
      ImDrawList::AddRectFilled(this_00,(ImVec2 *)&str,(ImVec2 *)&pin,col,0.0,0);
    }
  }
  bVar12 = ImGui::IsMouseDragging(0,-1.0);
  iVar18 = this->m_dragging_token;
  if (!bVar12) {
    if (iVar18 == 2) {
      iVar18 = (int)(this->m_info_surface).x;
      (this->config).infoPanelWidth = iVar18;
      Confparse::WriteInt(&this->obvconfig,"infoPanelWidth",iVar18);
    }
    this->m_dragging_token = 0;
    goto LAB_001105fd;
  }
  if (iVar18 == 0) {
    fVar21 = pIVar13->MouseClickedPos[0].x;
    fVar20 = (this->m_board_surface).x;
    if (fVar21 <= fVar20) goto LAB_001105fd;
    fVar22 = DPIF(20.0);
    if (fVar20 + fVar22 <= fVar21) {
      iVar18 = this->m_dragging_token;
      goto LAB_001105bc;
    }
    this->m_dragging_token = 2;
  }
  else {
LAB_001105bc:
    if (iVar18 != 2) goto LAB_001105fd;
  }
  IVar7 = ImGui::GetMouseDragDelta(0,-1.0);
  iVar18 = -(uint)(500.0 < ABS(IVar7.x));
  iVar19 = -(uint)(500.0 < ABS(IVar7.y));
  auVar8._4_4_ = iVar18;
  auVar8._0_4_ = iVar18;
  auVar8._8_4_ = iVar19;
  auVar8._12_4_ = iVar19;
  iVar18 = movmskpd((int)pIVar13,auVar8);
  ImGui::ResetMouseDragDelta(0);
  fVar21 = 0.0;
  if (iVar18 == 0) {
    fVar21 = IVar7.x;
  }
  fVar22 = (this->m_board_surface).x + fVar21;
  (this->m_board_surface).x = fVar22;
  (this->m_info_surface).x = fVar23 - fVar22;
  fVar20 = fVar23 * 0.66;
  if (fVar22 < fVar20) {
    (this->m_board_surface).x = fVar20;
    (this->m_info_surface).x = fVar23 - fVar20;
  }
  if (0.0 < fVar21) {
    this->m_needsRedraw = true;
  }
LAB_001105fd:
  if (this->m_board == (Board *)0x0) {
    ImGui::Text("No board currently loaded.");
  }
  else {
    ImGui::Columns(2,(char *)0x0,true);
    iVar18 = (*this->m_board->_vptr_Board[4])();
    ImGui::Text("Pins: %zu",
                ((long *)CONCAT44(extraout_var,iVar18))[1] - *(long *)CONCAT44(extraout_var,iVar18)
                >> 4);
    iVar18 = (*this->m_board->_vptr_Board[3])();
    ImGui::Text("Parts: %zu",
                ((long *)CONCAT44(extraout_var_00,iVar18))[1] -
                *(long *)CONCAT44(extraout_var_00,iVar18) >> 4);
    ImGui::NextColumn();
    (*this->m_board->_vptr_Board[2])();
    ImGui::Text("Nets: %zu");
    ImGui::TextWrapped("Size: %0.2f x %0.2f\"",SUB84((double)((float)this->m_boardWidth / 1000.0),0)
                       ,SUB84((double)((float)this->m_boardHeight / 1000.0),0));
    ImGui::Columns(1,(char *)0x0,true);
    ImGui::Separator();
    bVar12 = ImGui::Checkbox("Zoom on selected net",&(this->config).infoPanelCenterZoomNets);
    if (bVar12) {
      Confparse::WriteBool
                (&this->obvconfig,"infoPanelCenterZoomNets",(this->config).infoPanelCenterZoomNets);
    }
    bVar12 = ImGui::Checkbox("Select all parts on net",&(this->config).infoPanelSelectPartsOnNet);
    if (bVar12) {
      Confparse::WriteBool
                (&this->obvconfig,"infoPanelSelectPartsOnNet",
                 (this->config).infoPanelSelectPartsOnNet);
    }
  }
  if ((this->m_partHighlighted).
      super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (this->m_partHighlighted).
      super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    ImGui::Separator();
    std::__cxx11::to_string
              (&str,(long)(this->m_partHighlighted).
                          super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->m_partHighlighted).
                          super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 4);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)bn,&str,
                   " parts selected");
    ImGui::TextUnformatted((char *)bn._0_8_,(char *)0x0);
    std::__cxx11::string::~string((string *)bn);
    std::__cxx11::string::~string((string *)&str);
    p_Var2 = &((this->m_partHighlighted).
               super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->
              super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>;
    for (p_Var17 = &((this->m_partHighlighted).
                     super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                    super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>; p_Var17 != p_Var2;
        p_Var17 = p_Var17 + 1) {
      std::__shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&part.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>,p_Var17);
      ImGui::Text(" ");
      bVar12 = ImGui::SmallButton(((part.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr)->name)._M_dataplus._M_p);
      if (bVar12) {
        std::__shared_ptr<BoardElement,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Component,void>
                  ((__shared_ptr<BoardElement,(__gnu_cxx::_Lock_policy)2> *)&local_4a8,
                   &part.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>);
        if (local_4a8 == 0) {
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_4a0);
        }
        else {
          iVar18 = *(int *)(local_4a8 + 8);
          iVar19 = this->m_current_side;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_4a0);
          if ((iVar18 != 2) && (iVar18 != iVar19)) {
            FlipBoard(this,0);
          }
        }
        fVar23 = ((part.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 centerpoint).x;
        if ((fVar23 != 0.0) || (NAN(fVar23))) {
          fVar21 = ((part.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   centerpoint).y;
          if ((fVar21 == 0.0) && (!NAN(fVar21))) goto LAB_00110972;
          fVar20 = this->m_scale;
          IVar7 = ((part.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->outline)
                  ._M_elems[0];
          IVar1 = ((part.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->outline)
                  ._M_elems[2];
          auVar24._0_4_ = fVar20 * ABS(IVar1.x - IVar7.x);
          auVar24._4_4_ = fVar20 * ABS(IVar1.y - IVar7.y);
          auVar24._8_4_ = fVar20 * 0.0;
          auVar24._12_4_ = fVar20 * 0.0;
          auVar9._8_8_ = 0;
          auVar9._0_4_ = (this->m_board_surface).x;
          auVar9._4_4_ = (this->m_board_surface).y;
          auVar25 = divps(auVar24,auVar9);
          fVar22 = auVar25._4_4_;
          iVar18 = -(uint)(1.0 < auVar25._0_4_);
          auVar10._4_4_ = iVar18;
          auVar10._0_4_ = iVar18;
          auVar10._8_4_ = -(uint)(1.0 < fVar22);
          auVar10._12_4_ = -(uint)(1.0 < fVar22);
          iVar18 = movmskpd((int)part.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr,auVar10);
          if (iVar18 != 0) {
            if (auVar25._0_4_ <= fVar22) {
              auVar25._0_4_ = fVar22;
            }
            this->m_scale = fVar20 / (auVar25._0_4_ * (this->config).partZoomScaleOutFactor);
          }
        }
        else {
LAB_00110972:
          peVar3 = ((((part.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->pins)
                     .
                     super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                   super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          fVar23 = (peVar3->position).x;
          fVar21 = (peVar3->position).y;
        }
        SetTarget(this,fVar23,fVar21);
        this->m_needsRedraw = true;
      }
      ImGui::SameLine(0.0,-1.0);
      snprintf(bn,0x80,"Z##%s",
               ((part.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->name).
               _M_dataplus._M_p);
      bVar12 = ImGui::SmallButton(bn);
      if (bVar12) {
        std::__shared_ptr<BoardElement,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Component,void>
                  ((__shared_ptr<BoardElement,(__gnu_cxx::_Lock_policy)2> *)&local_4b8,
                   &part.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>);
        if (local_4b8 == 0) {
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_4b0);
        }
        else {
          iVar18 = *(int *)(local_4b8 + 8);
          iVar19 = this->m_current_side;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_4b0);
          if ((iVar18 != 2) && (iVar18 != iVar19)) {
            FlipBoard(this,0);
          }
        }
        fVar23 = ((part.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 centerpoint).x;
        if ((fVar23 != 0.0) || (NAN(fVar23))) {
          fVar21 = ((part.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   centerpoint).y;
          if ((fVar21 == 0.0) && (!NAN(fVar21))) goto LAB_00110abe;
          fVar20 = this->m_scale;
          IVar7 = ((part.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->outline)
                  ._M_elems[0];
          IVar1 = ((part.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->outline)
                  ._M_elems[2];
          auVar26._0_4_ = fVar20 * ABS(IVar1.x - IVar7.x);
          auVar26._4_4_ = fVar20 * ABS(IVar1.y - IVar7.y);
          auVar26._8_4_ = fVar20 * 0.0;
          auVar26._12_4_ = fVar20 * 0.0;
          auVar11._8_8_ = 0;
          auVar11._0_4_ = (this->m_board_surface).x;
          auVar11._4_4_ = (this->m_board_surface).y;
          auVar27 = divps(auVar26,auVar11);
          if (auVar27._0_4_ <= auVar27._4_4_) {
            auVar27._0_4_ = auVar27._4_4_;
          }
          this->m_scale = fVar20 / (auVar27._0_4_ * (this->config).partZoomScaleOutFactor);
        }
        else {
LAB_00110abe:
          peVar3 = ((((part.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->pins)
                     .
                     super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                   super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          fVar23 = (peVar3->position).x;
          fVar21 = (peVar3->position).y;
        }
        SetTarget(this,fVar23,fVar21);
        this->m_needsRedraw = true;
      }
      ImGui::SameLine(0.0,-1.0);
      ImGui::Text("%zu Pin(s)",
                  (long)((part.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                        pins).
                        super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)((part.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                        pins).
                        super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4);
      ImGui::SameLine(0.0,-1.0);
      snprintf(bn,0x80,"Copy##%s",
               ((part.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->name).
               _M_dataplus._M_p);
      bVar12 = ImGui::SmallButton(bn);
      if (bVar12) {
        std::__cxx11::string::string
                  ((string *)&str,
                   (string *)
                   &(part.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->name);
        if (((part.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->mfgcode).
            _M_string_length != 0) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pin,
                         " ",&(part.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                              )->mfgcode);
          std::__cxx11::string::append((string *)&str);
          std::__cxx11::string::~string((string *)&pin);
        }
        psVar4 = ((part.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->pins).
                 super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        for (psVar14 = ((part.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                       pins).
                       super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; psVar14 != psVar4;
            psVar14 = psVar14 + 1) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_478,"\n",
                         &((psVar14->super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                          name);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_478," ");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pin,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p,
                         &((psVar14->super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                          net->name);
          std::__cxx11::string::append((string *)&str);
          std::__cxx11::string::~string((string *)&pin);
          std::__cxx11::string::~string((string *)&p);
          std::__cxx11::string::~string((string *)local_478);
        }
        ImGui::SetClipboardText(str._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&str);
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)bn,
                     "PDF Search##",
                     &(part.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->name)
      ;
      bVar12 = ImGui::SmallButton((char *)bn._0_8_);
      if (bVar12) {
        PDFBridgeEvince::DocumentSearch
                  (&this->pdfBridge,
                   &(part.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->name,
                   ShowInfoPane::wholeWordsOnly,ShowInfoPane::caseSensitive);
      }
      ImGui::SameLine(0.0,-1.0);
      ImGui::Checkbox("Whole words only",&ShowInfoPane::wholeWordsOnly);
      ImGui::SameLine(0.0,-1.0);
      ImGui::Checkbox("Case sensitive",&ShowInfoPane::caseSensitive);
      std::__cxx11::string::~string((string *)bn);
      if (((part.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->mfgcode).
          _M_string_length != 0) {
        ImGui::TextWrapped("%s",((part.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr)->mfgcode)._M_dataplus._M_p);
      }
      ImGui::PushItemWidth(-1.0);
      std::__cxx11::string::string<std::allocator<char>>((string *)bn,"##",(allocator<char> *)&pin);
      std::operator+(&str,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)bn,
                     &(part.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->name)
      ;
      std::__cxx11::string::~string((string *)bn);
      local_478._0_8_ = (pointer)0x0;
      psVar14 = ((part.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->pins).
                super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      psVar4 = ((part.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->pins).
               super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      fVar23 = size->x;
      fVar21 = DPIF(50.0);
      fVar20 = ImGui::GetFontSize();
      iVar18 = (int)((ulong)((long)psVar14 - (long)psVar4) >> 4);
      if (0x13 < iVar18) {
        iVar18 = 0x14;
      }
      local_478._4_4_ = fVar20 * (float)iVar18 * 1.45;
      local_478._0_4_ = fVar23 - fVar21;
      bVar12 = ImGui::BeginListBox(str._M_dataplus._M_p,(ImVec2 *)local_478);
      if (bVar12) {
        p_Var5 = &(((part.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->pins).
                   super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish)->
                  super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>;
        for (p_Var15 = &(((part.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                         pins).
                         super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                        super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>; p_Var15 != p_Var5;
            p_Var15 = p_Var15 + 1) {
          std::__shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&pin.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>,p_Var15);
          snprintf(bn,0x400,"%4s  %s",
                   ((pin.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->name).
                   _M_dataplus._M_p,
                   ((pin.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->net->name).
                   _M_dataplus._M_p);
          p.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
          bVar12 = ImGui::Selectable(bn,pin.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>.
                                        _M_ptr == (this->m_pinSelected).
                                                  super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr,0,(ImVec2 *)&p);
          if (bVar12) {
            ClearAllHighlights(this);
            if ((*(uint *)&((pin.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                           super_BoardElement).field_0xc < 2) ||
               ((pin.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->net->is_ground ==
                true)) {
              std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
              ::push_back(&this->m_partHighlighted,
                          &(pin.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                           component);
            }
            else {
              std::__shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>::operator=
                        (&(this->m_pinSelected).super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>,
                         &pin.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>);
              p_Var6 = &((this->m_partHighlighted).
                         super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish)->
                        super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>;
              for (p_Var16 = &((this->m_partHighlighted).
                               super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                              super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>;
                  p_Var16 != p_Var6; p_Var16 = p_Var16 + 1) {
                std::__shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                          (&p.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>,p_Var16);
                (((pin.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->component).
                 super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->visualmode =
                     '\0';
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&p.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
                ;
              }
              std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
              ::push_back(&this->m_partHighlighted,
                          &(pin.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                           component);
              std::__cxx11::string::string
                        ((string *)&local_458,
                         (string *)
                         &(pin.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->net->
                          name);
              CenterZoomNet(this,&local_458);
              std::__cxx11::string::~string((string *)&local_458);
            }
            this->m_needsRedraw = true;
          }
          ImGui::PushStyleColor(5,0xffeeeeee);
          ImGui::Separator();
          ImGui::PopStyleColor(1);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&pin.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        }
        ImGui::EndListBox();
      }
      ImGui::PopItemWidth();
      std::__cxx11::string::~string((string *)&str);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&part.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
    ImGui::Text(" ");
    ImGui::Separator();
    ImGui::Separator();
    ImGui::Separator();
  }
  ImGui::End();
  ImGui::PopStyleVar(1);
  return;
}

Assistant:

void BoardView::ShowInfoPane(void) {
	ImGuiIO &io = ImGui::GetIO();
	ImVec2 ds   = io.DisplaySize;

	if (!config.showInfoPanel) return;

	if (m_info_surface.x < DPIF(100)) {
		//	fprintf(stderr,"Too small (%f), set to (%f)\n", width, DPIF(100));
		m_info_surface.x  = DPIF(100) + 1;
		m_board_surface.x = ds.x - m_info_surface.x;
	}

	m_info_surface.y = m_board_surface.y;

	/*
	 * Originally the dialog was to follow the cursor but it proved to be an overkill
	 * to try adjust things to keep it within the bounds of the window so as to not
	 * lose the buttons.
	 *
	 * Now it's kept at a fixed point.
	 */
	ImGui::SetNextWindowPos(ImVec2(ds.x - m_info_surface.x, m_menu_height));
	ImGui::SetNextWindowSize(m_info_surface);
	ImGui::PushStyleVar(ImGuiStyleVar_WindowBorderSize, 1.0f);
	ImGui::Begin("Info Panel",
	             NULL,
	             ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoMove | ImGuiWindowFlags_NoCollapse | ImGuiWindowFlags_NoResize |
	                 ImGuiWindowFlags_NoSavedSettings);

	if ((m_dragging_token == 0) && (io.MousePos.x > m_board_surface.x) && (io.MousePos.x < (m_board_surface.x + DPIF(12.0f)))) {
		ImDrawList *draw = ImGui::GetWindowDrawList();
		draw->AddRectFilled(ImVec2(m_board_surface.x, m_menu_height),
		                    ImVec2(m_board_surface.x + DPIF(12.0f), m_board_surface.y + m_menu_height),
		                    ImColor(0x88888888));
		//			DrawHex( draw, io.MousePos, DPIF(10.0f), ImColor(0xFF0000FF) );
	}

	if (ImGui::IsMouseDragging(0)) {
		if ((m_dragging_token == 0) && (io.MouseClickedPos[0].x > m_board_surface.x) &&
		    (io.MouseClickedPos[0].x < (m_board_surface.x + DPIF(20.0f))))
			m_dragging_token = 2; // own it.
		if (m_dragging_token == 2) {
			ImVec2 delta = ImGui::GetMouseDragDelta();
			if ((abs(delta.x) > 500) || (abs(delta.y) > 500)) {
				delta.x = 0;
				delta.y = 0;
			} // If the delta values are crazy just drop them (happens when panning
			// off screen). 500 arbritary chosen
			ImGui::ResetMouseDragDelta();
			m_board_surface.x += delta.x;
			m_info_surface.x = ds.x - m_board_surface.x;
			if (m_board_surface.x < ds.x * 0.66) {
				m_board_surface.x = ds.x * 0.66;
				m_info_surface.x  = ds.x - m_board_surface.x;
			}
			if (delta.x > 0) m_needsRedraw = true;
		}
	} else {
		if (m_dragging_token == 2) {
			config.infoPanelWidth = m_info_surface.x;
			obvconfig.WriteInt("infoPanelWidth", m_info_surface.x);
		}
		m_dragging_token = 0;
	}

	if (m_board) {
		ImGui::Columns(2);
		ImGui::Text("Pins: %zu", m_board->Pins().size());
		ImGui::Text("Parts: %zu", m_board->Components().size());
		ImGui::NextColumn();
		ImGui::Text("Nets: %zu", m_board->Nets().size());
		ImGui::TextWrapped("Size: %0.2f x %0.2f\"", m_boardWidth / 1000.0f, m_boardHeight / 1000.0f);
		ImGui::Columns(1);
		ImGui::Separator();
		if (ImGui::Checkbox("Zoom on selected net", &config.infoPanelCenterZoomNets)) {
			obvconfig.WriteBool("infoPanelCenterZoomNets", config.infoPanelCenterZoomNets);
		}
		if (ImGui::Checkbox("Select all parts on net", &config.infoPanelSelectPartsOnNet)) {
			obvconfig.WriteBool("infoPanelSelectPartsOnNet", config.infoPanelSelectPartsOnNet);
		}
	} else {
		ImGui::Text("No board currently loaded.");
	}

	if (m_partHighlighted.size()) {
		ImGui::Separator();
		ImGui::TextUnformatted((std::to_string(m_partHighlighted.size()) + " parts selected").c_str());

		for (auto part : m_partHighlighted) {

			ImGui::Text(" ");

			if (ImGui::SmallButton(part->name.c_str())) {
				if (!BoardElementIsVisible(part)) FlipBoard();
				if (part->centerpoint.x && part->centerpoint.y) {
					ImVec2 psz;

					/*
					 * Check to see if we need to zoom BACK a bit to fit the part in to view
					 */
					psz = ImVec2(abs(part->outline[2].x - part->outline[0].x) * m_scale / m_board_surface.x,
					             abs(part->outline[2].y - part->outline[0].y) * m_scale / m_board_surface.y);
					if ((psz.x > 1) || (psz.y > 1)) {
						if (psz.x > psz.y) {
							m_scale /= (config.partZoomScaleOutFactor * psz.x);
						} else {
							m_scale /= (config.partZoomScaleOutFactor * psz.y);
						}
					}

					SetTarget(part->centerpoint.x, part->centerpoint.y);
				} else {
					SetTarget(part->pins[0]->position.x, part->pins[0]->position.y);
				}
				m_needsRedraw = 1;
			}
			ImGui::SameLine();
			{
				char bn[128];
				snprintf(bn, sizeof(bn), "Z##%s", part->name.c_str());
				if (ImGui::SmallButton(bn)) {
					if (!BoardElementIsVisible(part)) FlipBoard();
					if (part->centerpoint.x && part->centerpoint.y) {
						ImVec2 psz;

						/*
						 * Check to see if we need to zoom BACK a bit to fit the part in to view
						 */
						psz = ImVec2(abs(part->outline[2].x - part->outline[0].x) * m_scale / m_board_surface.x,
						             abs(part->outline[2].y - part->outline[0].y) * m_scale / m_board_surface.y);
						if (psz.x > psz.y) {
							m_scale /= (config.partZoomScaleOutFactor * psz.x);
						} else {
							m_scale /= (config.partZoomScaleOutFactor * psz.y);
						}

						SetTarget(part->centerpoint.x, part->centerpoint.y);
					} else {
						SetTarget(part->pins[0]->position.x, part->pins[0]->position.y);
					}
					m_needsRedraw = 1;
				}
			}

			ImGui::SameLine();
			ImGui::Text("%zu Pin(s)", part->pins.size());
			ImGui::SameLine();
			{
				char name_and_id[128];
				snprintf(name_and_id, sizeof(name_and_id), "Copy##%s", part->name.c_str());
				if (ImGui::SmallButton(name_and_id)) {
					// std::string speed is no concern here, since button action is not in UI rendering loop
					std::string to_copy = part->name;
					if (part->mfgcode.size()) {
						to_copy += " " + part->mfgcode;
					}
					for (const auto &pin : part->pins) {
						to_copy += "\n" + pin->name + " " + pin->net->name;
					}
					ImGui::SetClipboardText(to_copy.c_str());
				}
			}

			{
				static bool wholeWordsOnly = true;
				static bool caseSensitive = false;
				std::string pdfButtonName = "PDF Search##" + part->name;
				if (ImGui::SmallButton(pdfButtonName.c_str())) {
					pdfBridge.DocumentSearch(part->name, wholeWordsOnly, caseSensitive);
				}
				ImGui::SameLine();
				ImGui::Checkbox("Whole words only", &wholeWordsOnly);
				ImGui::SameLine();
				ImGui::Checkbox("Case sensitive", &caseSensitive);
			}

			if (part->mfgcode.size()) ImGui::TextWrapped("%s", part->mfgcode.c_str());

			/*
			 * Generate the pin# and net table
			 */
			ImGui::PushItemWidth(-1);
			std::string str = std::string("##") + part->name;
			ImVec2 listSize;
			int pc = part->pins.size();
			if (pc > 20) pc = 20;
			listSize = ImVec2(m_info_surface.x - DPIF(50), pc * ImGui::GetFontSize() * 1.45);
			if (ImGui::BeginListBox(str.c_str(), listSize)) { //, ImVec2(m_board_surface.x/3 -5, m_board_surface.y/2));
				for (auto pin : part->pins) {
					char ss[1024];
					snprintf(ss, sizeof(ss), "%4s  %s", pin->name.c_str(), pin->net->name.c_str());
					if (ImGui::Selectable(ss, (pin == m_pinSelected))) {
						ClearAllHighlights();

						if ((pin->type == Pin::kPinTypeNotConnected) || (pin->type == Pin::kPinTypeUnkown) || (pin->net->is_ground)) {
							m_partHighlighted.push_back(pin->component);
							// do nothing for now
							//
						} else {
							m_pinSelected = pin;
							for (auto p : m_partHighlighted) {
								pin->component->visualmode = pin->component->CVMNormal;
							};
							m_partHighlighted.push_back(pin->component);
							CenterZoomNet(pin->net->name);
						}
						m_needsRedraw = true;
					}
					ImGui::PushStyleColor(ImGuiCol_Border, 0xffeeeeee);
					ImGui::Separator();
					ImGui::PopStyleColor();
				}
				ImGui::EndListBox();
			}
			ImGui::PopItemWidth();

		} // for each part in the list
		ImGui::Text(" ");
		ImGui::Separator();
		ImGui::Separator();
		ImGui::Separator();
	}

	ImGui::End();
	ImGui::PopStyleVar();
}